

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::Close(CWallet *this)

{
  WalletDatabase *pWVar1;
  long in_FS_OFFSET;
  CWallet *this_00;
  
  this_00 = *(CWallet **)(in_FS_OFFSET + 0x28);
  pWVar1 = GetDatabase(this_00);
  (*pWVar1->_vptr_WalletDatabase[8])();
  if (*(CWallet **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::Close()
{
    GetDatabase().Close();
}